

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lc.cpp
# Opt level: O0

double __thiscall libDAI::LC::CalcCavityDist(LC *this,size_t i,string *name,Properties *opts)

{
  value vVar1;
  int iVar2;
  ulong uVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  undefined8 uVar7;
  size_type sVar8;
  size_t sVar9;
  undefined4 extraout_var;
  size_type sVar10;
  GraphicalModel *this_00;
  size_type in_RSI;
  long *in_RDI;
  TFactor<double> *pTVar11;
  size_t ij;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> pairbeliefs;
  InferenceAlgorithm *cav;
  double maxdiff;
  Factor Bi;
  undefined4 in_stack_fffffffffffffc68;
  NormType in_stack_fffffffffffffc6c;
  TFactor<double> *in_stack_fffffffffffffc70;
  TFactor<double> *in_stack_fffffffffffffc80;
  VarSet *in_stack_fffffffffffffc88;
  TFactor<double> *in_stack_fffffffffffffc90;
  TFactor<double> *in_stack_fffffffffffffcc8;
  TFactor<double> *in_stack_fffffffffffffcd0;
  undefined1 reInit;
  VarSet *in_stack_fffffffffffffcf0;
  InferenceAlgorithm *in_stack_fffffffffffffcf8;
  Properties *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  string *in_stack_fffffffffffffd18;
  ulong local_200;
  undefined1 local_1f8 [32];
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_1d8;
  undefined1 local_1c0 [88];
  undefined1 local_168 [88];
  InferenceAlgorithm *local_110;
  undefined1 local_108 [7];
  undefined1 in_stack_fffffffffffffeff;
  VarSet *in_stack_ffffffffffffff00;
  InferenceAlgorithm *in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff4f;
  VarSet *in_stack_ffffffffffffff50;
  InferenceAlgorithm *in_stack_ffffffffffffff58;
  undefined1 local_90 [48];
  TFactor<double> *local_60;
  size_type local_10;
  
  local_10 = in_RSI;
  TFactor<double>::TFactor(in_stack_fffffffffffffc80);
  local_60 = (TFactor<double> *)0x0;
  uVar3 = (**(code **)(*in_RDI + 0x30))();
  if (1 < uVar3) {
    std::operator<<((ostream *)&std::cout,"Initing cavity ");
    plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
    (**(code **)(*plVar4 + 0x30))(plVar4,local_10);
    poVar5 = libDAI::operator<<((ostream *)in_stack_fffffffffffffc70,
                                (Var *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68)
                               );
    poVar5 = std::operator<<(poVar5,"(");
    plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
    plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar7 = (**(code **)(*plVar6 + 0x30))(plVar6,local_10);
    (**(code **)(*plVar4 + 0x70))(local_90,plVar4,uVar7);
    sVar8 = VarSet::size((VarSet *)0xb787be);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar8);
    poVar5 = std::operator<<(poVar5," vars, ");
    plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
    plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar7 = (**(code **)(*plVar6 + 0x30))(plVar6,local_10);
    (**(code **)(*plVar4 + 0x70))(&stack0xffffffffffffff50,plVar4,uVar7);
    sVar9 = VarSet::stateSpace((VarSet *)&stack0xffffffffffffff50);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar9);
    poVar5 = std::operator<<(poVar5," states)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    VarSet::~VarSet((VarSet *)0xb788f8);
    VarSet::~VarSet((VarSet *)0xb78905);
  }
  vVar1 = CavityType::operator_cast_to_value((CavityType *)((long)in_RDI + 0x11c));
  if (vVar1 == UNIFORM) {
    plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
    plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar7 = (**(code **)(*plVar6 + 0x30))(plVar6,local_10);
    (**(code **)(*plVar4 + 0x70))(local_108,plVar4,uVar7);
    TFactor<double>::TFactor(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    TFactor<double>::operator=
              (in_stack_fffffffffffffc70,
               (TFactor<double> *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    TFactor<double>::~TFactor(in_stack_fffffffffffffc70);
    VarSet::~VarSet((VarSet *)0xb78a5a);
  }
  else {
    (**(code **)(*in_RDI + 0x28))();
    local_110 = newInfAlg(in_stack_fffffffffffffd18,
                          (FactorGraph *)
                          CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                          in_stack_fffffffffffffd08);
    iVar2 = (*local_110->_vptr_InferenceAlgorithm[5])();
    plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar7 = (**(code **)(*plVar4 + 0x30))(plVar4,local_10);
    pTVar11 = (TFactor<double> *)
              (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xa0))
                        ((long *)CONCAT44(extraout_var,iVar2),uVar7);
    vVar1 = CavityType::operator_cast_to_value((CavityType *)((long)in_RDI + 0x11c));
    if (vVar1 == FULL) {
      plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
      plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
      uVar7 = (**(code **)(*plVar6 + 0x30))(plVar6,local_10);
      pTVar11 = (TFactor<double> *)(**(code **)(*plVar4 + 0x70))(local_168,plVar4,uVar7);
      calcMarginal(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                   (bool)in_stack_fffffffffffffeff);
      TFactor<double>::operator=
                (in_stack_fffffffffffffc70,
                 (TFactor<double> *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      TFactor<double>::~TFactor(in_stack_fffffffffffffc70);
      VarSet::~VarSet((VarSet *)0xb78c9c);
    }
    else {
      vVar1 = CavityType::operator_cast_to_value((CavityType *)((long)in_RDI + 0x11c));
      if (vVar1 == PAIR) {
        plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
        reInit = (undefined1)(vVar1 >> 0x18);
        plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
        uVar7 = (**(code **)(*plVar6 + 0x30))(plVar6,local_10);
        pTVar11 = (TFactor<double> *)(**(code **)(*plVar4 + 0x70))(local_1c0,plVar4,uVar7);
        calcMarginal2ndO(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,(bool)reInit);
        TFactor<double>::operator=
                  (in_stack_fffffffffffffc70,
                   (TFactor<double> *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68))
        ;
        TFactor<double>::~TFactor(in_stack_fffffffffffffc70);
        VarSet::~VarSet((VarSet *)0xb78ded);
      }
      else {
        vVar1 = CavityType::operator_cast_to_value((CavityType *)((long)in_RDI + 0x11c));
        if (vVar1 == PAIR2) {
          plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
          plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
          uVar7 = (**(code **)(*plVar6 + 0x30))(plVar6,local_10);
          pTVar11 = (TFactor<double> *)(**(code **)(*plVar4 + 0x70))(local_1f8,plVar4,uVar7);
          calcPairBeliefsNew(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                             (bool)in_stack_ffffffffffffff4f);
          VarSet::~VarSet((VarSet *)0xb78f14);
          for (local_200 = 0;
              sVar10 = std::
                       vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
                       size(&local_1d8), local_200 < sVar10; local_200 = local_200 + 1) {
            std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
            operator[](&local_1d8,local_200);
            TFactor<double>::operator*=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          }
          std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
                    ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                     in_stack_fffffffffffffc80);
        }
      }
    }
    (*local_110->_vptr_InferenceAlgorithm[8])();
    local_60 = pTVar11;
    if (local_110 != (InferenceAlgorithm *)0x0) {
      (*local_110->_vptr_InferenceAlgorithm[3])();
    }
  }
  this_00 = (GraphicalModel *)(**(code **)(*in_RDI + 0x28))();
  GraphicalModel::normType(this_00);
  TFactor<double>::normalize(in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             (in_RDI + 0x38),local_10);
  TFactor<double>::operator=
            (in_stack_fffffffffffffc70,
             (TFactor<double> *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  TFactor<double>::~TFactor(local_60);
  return (double)local_60;
}

Assistant:

double LC::CalcCavityDist (size_t i, const std::string &name, const Properties &opts) {
        Factor Bi;
        double maxdiff = 0;

        if( Verbose() >= 2 )
            cout << "Initing cavity " << grm().var(i) << "(" << grm().delta(grm().var(i)).size() << " vars, " << grm().delta(grm().var(i)).stateSpace() << " states)" << endl;

        if( Props.cavity == CavityType::UNIFORM )
            Bi = Factor(grm().delta(grm().var(i)));
/*        else if( Props.cavity == CavityType::FULLCLUSTER ) {
            vector<Factor> facs;
            Var vi = grm().var(i);
            VarSet di = grm().delta(vi);
            VarSet Di = grm().Delta(vi);

            // construct new supervariable out of di
            long label = 0;
            for( size_t j = 0; j < grm().nrVars(); j++ )
                if( grm().var(j).label() >= label )
                    label = grm().var(j).label() + 1;
            Var new_di( label, di.stateSpace() );
            if( Verbose() >= 3 )
                cout << "new supervar " << new_di << " instead of " << di << endl;

            for( size_t I = 0; I < grm().nrFactors(); I++ ) {
                VarSet Ivars = grm().factor(I).vars();
                if( !(Ivars && Di) ) {
                    facs.push_back( grm().factor(I) );
                    if( Verbose() >= 3 )
                        cout << Ivars << endl;
                } else if( !(Ivars >> vi) ) {
                    Factor tmpI = grm().factor(I).embed( Ivars | di );
                    vector<double> values;
                    for( size_t di_state = 0; di_state < di.stateSpace(); di_state++ ) {
                        // copy slice
                        Prob sl = tmpI.slice( di, di_state ).p();
                        values.insert( values.end(), sl.p().begin(), sl.p().end() );
                    }
                    facs.push_back( Factor((Ivars / di) | new_di, &(values[0])) );
                    if( Verbose() >= 3 )
                        cout << "super: " << ((Ivars / di) | new_di) << endl;
                } else {
                    if( Verbose() >= 3 )
                        cout << "dropping " << Ivars << endl;
                }
            }
            FactorGraph fg(facs);
            InferenceAlgorithm *cav = newInfAlg( name, fg, opts );
            cav->init();
            cav->run();
            Prob Bivalues = cav->belief( new_di ).p();
            Bi = Factor( di, Bivalues );
            if( Verbose() >= 2 ) {
                cout << Bi << endl;

                InferenceAlgorithm *cav2 = newInfAlg( name, grm(), opts );
                cav2->grm().makeCavity( vi );
                cav2->init();
                cav2->run();
                Factor Bi2;
                for( VarSet::const_iterator j = di.begin(); j != di.end(); j++ )
                    Bi2 *= cav2->belief( *j );

                cout << Bi2 << endl;
            }
        } */
        else {
            InferenceAlgorithm *cav = newInfAlg( name, grm(), opts );
            cav->grm().makeCavity( grm().var(i) );

            if( Props.cavity == CavityType::FULL )
                Bi = calcMarginal( *cav, grm().delta(grm().var(i)), Props.reinit );
            else if( Props.cavity == CavityType::PAIR )
                Bi = calcMarginal2ndO( *cav, grm().delta(grm().var(i)), Props.reinit );
            else if( Props.cavity == CavityType::PAIR2 ) {
                vector<Factor> pairbeliefs = calcPairBeliefsNew( *cav, grm().delta(grm().var(i)), Props.reinit );
                for( size_t ij = 0; ij < pairbeliefs.size(); ij++ )
                    Bi *= pairbeliefs[ij];
            }
            maxdiff = cav->maxDiff();
            delete cav;
        }
        Bi.normalize( grm().normType() );
        _cavitydists[i] = Bi;

        return maxdiff;
    }